

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# maybe.hpp
# Opt level: O2

maybe<unsigned_int,_void> * __thiscall
pstore::maybe<unsigned_int,_void>::operator=
          (maybe<unsigned_int,_void> *this,maybe<unsigned_int,_void> *other)

{
  uint *other_00;
  
  if (other != this) {
    if (other->valid_ == false) {
      if (this->valid_ == true) {
        this->valid_ = false;
      }
    }
    else {
      other_00 = maybe<unsigned_int,void>::
                 value_impl<pstore::maybe<unsigned_int,void>&,unsigned_int>(other);
      maybe<unsigned_int,void>::operator=((maybe<unsigned_int,void> *)this,other_00);
    }
  }
  return this;
}

Assistant:

maybe &
        operator= (maybe && other) noexcept (std::is_nothrow_move_assignable<T>::value &&
                                                 std::is_nothrow_move_constructible<T>::value) {

            if (&other != this) {
                if (!other.has_value ()) {
                    this->reset ();
                } else {
                    this->operator= (std::forward<T> (other.value ()));
                }
            }
            return *this;
        }